

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_dispatch_incoming_commands(ENetHost *host,ENetEvent *event)

{
  int iVar1;
  long lVar2;
  ENetHost *host_00;
  ENetPacket *pEVar3;
  ENetPeer *in_RSI;
  long in_RDI;
  ENetPeer *peer;
  undefined4 in_stack_ffffffffffffffd8;
  
  while( true ) {
    if (*(long *)(in_RDI + 0x48) == in_RDI + 0x48) {
      return 0;
    }
    host_00 = (ENetHost *)enet_list_remove(*(ENetListIterator *)(in_RDI + 0x48));
    *(undefined4 *)((long)host_00->commands + 0xd4) = 0;
    iVar1 = (int)host_00->channelLimit;
    if (iVar1 - 3U < 2) break;
    if (iVar1 == 5) {
      if (*(undefined1 **)((long)host_00->commands + 0xc4) !=
          (undefined1 *)((long)host_00->commands + 0xc4)) {
        pEVar3 = enet_peer_receive(in_RSI,(enet_uint8 *)host_00);
        *(ENetPacket **)&in_RSI->outgoingPeerID = pEVar3;
        lVar2._0_4_ = in_RSI->outgoingPeerID;
        lVar2._4_4_ = in_RSI->incomingPeerID;
        if (lVar2 != 0) {
          *(undefined4 *)&(in_RSI->dispatchList).next = 3;
          (in_RSI->dispatchList).previous = (_ENetListNode *)host_00;
          if (*(undefined1 **)((long)host_00->commands + 0xc4) !=
              (undefined1 *)((long)host_00->commands + 0xc4)) {
            *(undefined4 *)((long)host_00->commands + 0xd4) = 1;
            enet_list_insert((ENetListIterator)(in_RDI + 0x48),host_00);
          }
          return 1;
        }
      }
    }
    else if (iVar1 == 9) {
      *(undefined4 *)(in_RDI + 0x20) = 1;
      *(undefined4 *)&(in_RSI->dispatchList).next = 2;
      (in_RSI->dispatchList).previous = (_ENetListNode *)host_00;
      *(undefined4 *)((long)&in_RSI->host + 4) = *(undefined4 *)((long)host_00->commands + 0x15c);
      enet_peer_reset((ENetPeer *)0x108da5);
      return 1;
    }
  }
  enet_protocol_change_state
            (host_00,(ENetPeer *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
             ENET_PEER_STATE_DISCONNECTED);
  *(undefined4 *)&(in_RSI->dispatchList).next = 1;
  (in_RSI->dispatchList).previous = (_ENetListNode *)host_00;
  *(undefined4 *)((long)&in_RSI->host + 4) = *(undefined4 *)((long)host_00->commands + 0x15c);
  return 1;
}

Assistant:

static int
enet_protocol_dispatch_incoming_commands (ENetHost * host, ENetEvent * event)
{
    while (! enet_list_empty (& host -> dispatchQueue))
    {
       ENetPeer * peer = (ENetPeer *) enet_list_remove (enet_list_begin (& host -> dispatchQueue));

       peer -> needsDispatch = 0;

       switch (peer -> state)
       {
       case ENET_PEER_STATE_CONNECTION_PENDING:
       case ENET_PEER_STATE_CONNECTION_SUCCEEDED:
           enet_protocol_change_state (host, peer, ENET_PEER_STATE_CONNECTED);

           event -> type = ENET_EVENT_TYPE_CONNECT;
           event -> peer = peer;
           event -> data = peer -> eventData;

           return 1;
           
       case ENET_PEER_STATE_ZOMBIE:
           host -> recalculateBandwidthLimits = 1;

           event -> type = ENET_EVENT_TYPE_DISCONNECT;
           event -> peer = peer;
           event -> data = peer -> eventData;

           enet_peer_reset (peer);

           return 1;

       case ENET_PEER_STATE_CONNECTED:
           if (enet_list_empty (& peer -> dispatchedCommands))
             continue;

           event -> packet = enet_peer_receive (peer, & event -> channelID);
           if (event -> packet == NULL)
             continue;
             
           event -> type = ENET_EVENT_TYPE_RECEIVE;
           event -> peer = peer;

           if (! enet_list_empty (& peer -> dispatchedCommands))
           {
              peer -> needsDispatch = 1;
         
              enet_list_insert (enet_list_end (& host -> dispatchQueue), & peer -> dispatchList);
           }

           return 1;

       default:
           break;
       }
    }

    return 0;
}